

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::request_time_critical_pieces(torrent *this)

{
  pointer *this_00;
  reference i_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  back_insert_iterator<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>_>
  bVar6;
  pointer ppVar7;
  int64_t iVar8;
  int *piVar9;
  value_type *pppVar10;
  reference pppVar11;
  time_point *ptVar12;
  vector<peer_connection_*> *this_01;
  bool local_261;
  bool local_1ed;
  peer_connection *p;
  iterator __end2_1;
  iterator __begin2_1;
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  *__range2_1;
  duration<long,_std::ratio<1L,_1000L>_> local_190;
  duration<long,_std::ratio<1L,_1000000000L>_> local_188 [2];
  peer_connection **local_178;
  peer_connection **local_170;
  peer_connection **local_168;
  peer_connection **local_160;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_158;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_150;
  const_iterator local_148;
  int local_140;
  int local_13c;
  rep local_138;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  int local_124;
  int local_120;
  int free_to_request;
  int local_118;
  int blocks_in_piece;
  int timed_out;
  undefined1 auStack_10a [2];
  downloading_piece pi;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  reference local_f0;
  time_critical_piece *i;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  *__range2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_c8;
  bool first_piece;
  time_point now;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ignore_peers;
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers_with_requests;
  int new_size;
  undefined1 local_28 [8];
  vector<peer_connection_*> peers;
  torrent *this_local;
  
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  ::container_wrapper((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       *)local_28);
  iVar3 = num_peers(this);
  container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
  ::reserve<int,void>((container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                       *)local_28,iVar3);
  this_01 = &(this->super_torrent_hot_members).m_connections;
  iVar4 = ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::begin(&this_01->
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 );
  iVar5 = ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::end(&this_01->
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               );
  bVar6 = ::std::
          back_inserter<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>
                    ((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                      *)local_28);
  ::std::
  remove_copy_if<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,std::back_insert_iterator<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>,libtorrent::aux::torrent::request_time_critical_pieces()::__0>
            (iVar4._M_current,iVar5._M_current,bVar6.container);
  iVar4 = ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   *)local_28);
  iVar5 = ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::end((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 *)local_28);
  ::std::
  sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::torrent::request_time_critical_pieces()::__1>
            (iVar4._M_current,iVar5._M_current);
  iVar3 = container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
          ::end_index((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       *)local_28);
  container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
  ::resize<int,void>((container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                      *)local_28,(iVar3 * 9 + 9) / 10);
  ::std::
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::set((set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
         *)&ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          *)&now);
  tStack_c8.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  bVar2 = true;
  __end2 = ::std::
           vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ::begin(&this->m_time_critical_pieces);
  i = (time_critical_piece *)
      ::std::
      vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
      ::end(&this->m_time_critical_pieces);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                                     *)&i), bVar1) {
    local_f0 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
               ::operator*(&__end2);
    bVar1 = ::std::
            vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ::empty((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     *)local_28);
    if (bVar1) break;
    local_1ed = false;
    if (!bVar2) {
      ptVar12 = &local_f0->deadline;
      pi._4_4_ = this->m_average_piece_time + 1000 + this->m_piece_time_deviation * 4;
      ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&pi.field_0x8,(int *)&pi.info_idx);
      local_f8 = ::std::chrono::operator+
                           (&stack0xffffffffffffff38,
                            (duration<long,_std::ratio<1L,_1000L>_> *)&pi.field_0x8);
      local_1ed = ::std::chrono::operator>(ptVar12,&local_f8);
    }
    if (local_1ed != false) break;
    bVar2 = false;
    piece_picker::downloading_piece::downloading_piece((downloading_piece *)&timed_out);
    ppVar7 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    blocks_in_piece = (local_f0->piece).m_val;
    piece_picker::piece_info(ppVar7,(piece_index_t)blocks_in_piece,(downloading_piece *)&timed_out);
    local_118 = 0;
    ppVar7 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    local_120 = (local_f0->piece).m_val;
    free_to_request = piece_picker::blocks_in_piece(ppVar7,(piece_index_t)local_120);
    local_124 = ((free_to_request - (_auStack_10a & 0x7fff)) - (_auStack_10a >> 0x10 & 0x7fff)) -
                (uint)(pi.index.m_val._2_2_ & 0x7fff);
    if (local_124 == 0) {
      ptVar12 = &local_f0->last_requested;
      local_130.__d.__r = (duration)min_time();
      bVar1 = ::std::chrono::operator==(ptVar12,&local_130);
      if (bVar1) {
        (local_f0->last_requested).__d.__r = (rep)tStack_c8.__d.__r;
      }
      if (0 < this->m_average_piece_time) {
        local_138 = (rep)::std::chrono::operator-
                                   (&stack0xffffffffffffff38,&local_f0->last_requested);
        iVar8 = total_milliseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)local_138);
        local_13c = this->m_average_piece_time + this->m_piece_time_deviation / 2;
        local_140 = 1;
        piVar9 = ::std::max<int>(&local_13c,&local_140);
        local_118 = (int)(iVar8 / (long)*piVar9);
      }
      if (((pi.index.m_val._2_2_ & 0x7fff) != 0) && (local_118 != 0)) goto LAB_0069632f;
    }
    else {
LAB_0069632f:
      i_00 = local_f0;
      ppVar7 = ::std::
               unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ::get(&(this->super_torrent_hot_members).m_picker);
      anon_unknown_135::pick_time_critical_block
                ((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  *)local_28,
                 (vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  *)&now,(set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          *)&ignore_peers.
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (downloading_piece *)&timed_out,i_00,ppVar7,free_to_request,local_118);
      bVar1 = ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::empty((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       *)&now);
      if (!bVar1) {
        local_150._M_current =
             (peer_connection **)
             ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      *)local_28);
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
        ::__normal_iterator<libtorrent::aux::peer_connection**>
                  ((__normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                    *)&local_148,&local_150);
        local_158._M_current =
             (peer_connection **)
             ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      *)&now);
        local_160 = (peer_connection **)
                    ::std::
                    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ::end((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           *)&now);
        local_168 = (peer_connection **)
                    ::std::
                    vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,void>
                              ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                                *)local_28,local_148,local_158,
                               (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                )local_160);
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::clear((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 *)&now);
        local_170 = (peer_connection **)
                    ::std::
                    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             *)local_28);
        local_178 = (peer_connection **)
                    ::std::
                    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ::end((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           *)local_28);
        ::std::
        sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::torrent::request_time_critical_pieces()::__2>
                  (local_170);
      }
      bVar1 = ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::empty((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       *)local_28);
      local_261 = false;
      if (!bVar1) {
        pppVar10 = container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                   ::operator[]((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                 *)local_28,0);
        local_188[0].__r = (rep)peer_connection::download_queue_time(*pppVar10,0);
        __range2_1._4_4_ = 2000;
        ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_190,(int *)((long)&__range2_1 + 4))
        ;
        local_261 = ::std::chrono::operator>(local_188,&local_190);
      }
      if (local_261 != false) break;
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
    ::operator++(&__end2);
  }
  this_00 = &ignore_peers.
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = ::std::
             set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin((set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      *)this_00);
  p = (peer_connection *)
      ::std::
      set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::end((set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
             *)this_00);
  while (bVar2 = ::std::operator!=(&__end2_1,(_Self *)&p), bVar2) {
    pppVar11 = ::std::_Rb_tree_const_iterator<libtorrent::aux::peer_connection_*>::operator*
                         (&__end2_1);
    peer_connection::send_block_requests(*pppVar11);
    ::std::_Rb_tree_const_iterator<libtorrent::aux::peer_connection_*>::operator++(&__end2_1);
  }
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  ~vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           *)&now);
  ::std::
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::~set((set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
          *)&ignore_peers.
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  ::~container_wrapper
            ((container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              *)local_28);
  return;
}

Assistant:

void torrent::request_time_critical_pieces()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!upload_mode());

		// build a list of peers and sort it by download_queue_time
		// we use this sorted list to determine which peer we should
		// request a block from. The earlier a peer is in the list,
		// the sooner we will fully download the block we request.
		aux::vector<peer_connection*> peers;
		peers.reserve(num_peers());

		// some peers are marked as not being able to request time critical
		// blocks from. For instance, peers that have choked us, peers that are
		// on parole (i.e. they are believed to have sent us bad data), peers
		// that are being disconnected, in upload mode etc.
		std::remove_copy_if(m_connections.begin(), m_connections.end()
			, std::back_inserter(peers), [] (peer_connection* p)
			{ return !p->can_request_time_critical(); });

		// sort by the time we believe it will take this peer to send us all
		// blocks we've requested from it. The shorter time, the better candidate
		// it is to request a time critical block from.
		std::sort(peers.begin(), peers.end()
			, [] (peer_connection const* lhs, peer_connection const* rhs)
			{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });

		// remove the bottom 10% of peers from the candidate set.
		// this is just to remove outliers that might stall downloads
		int const new_size = (peers.end_index() * 9 + 9) / 10;
		TORRENT_ASSERT(new_size <= peers.end_index());
		peers.resize(new_size);

		// remember all the peers we issued requests to, so we can commit them
		// at the end of this function. Instead of sending the requests right
		// away, we batch them up and send them in a single write to the TCP
		// socket, increasing the chance that they will all be sent in the same
		// packet.
		std::set<peer_connection*> peers_with_requests;

		// peers that should be temporarily ignored for a specific piece
		// in order to give priority to other peers. They should be used for
		// subsequent pieces, so they are stored in this vector until the
		// piece is done
		std::vector<peer_connection*> ignore_peers;

		time_point const now = clock_type::now();

		// now, iterate over all time critical pieces, in order of importance, and
		// request them from the peers, in order of responsiveness. i.e. request
		// the most time critical pieces from the fastest peers.
		bool first_piece{true};
		for (auto& i : m_time_critical_pieces)
		{
#if TORRENT_DEBUG_STREAMING > 1
			std::printf("considering %d\n", i->piece);
#endif

			if (peers.empty())
			{
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("out of peers, done\n");
#endif
				break;
			}

			// the +1000 is to compensate for the fact that we only call this
			// function once per second, so if we need to request it 500 ms from
			// now, we should request it right away
			if (!first_piece && i.deadline > now
				+ milliseconds(m_average_piece_time + m_piece_time_deviation * 4 + 1000))
			{
				// don't request pieces whose deadline is too far in the future
				// this is one of the termination conditions. We don't want to
				// send requests for all pieces in the torrent right away
#if TORRENT_DEBUG_STREAMING > 0
				std::printf("reached deadline horizon [%f + %f * 4 + 1]\n"
					, m_average_piece_time / 1000.f
					, m_piece_time_deviation / 1000.f);
#endif
				break;
			}
			first_piece = false;

			piece_picker::downloading_piece pi;
			m_picker->piece_info(i.piece, pi);

			// the number of "times" this piece has timed out.
			int timed_out = 0;

			int const blocks_in_piece = m_picker->blocks_in_piece(i.piece);

#if TORRENT_DEBUG_STREAMING > 0
			i.timed_out = timed_out;
#endif
			int const free_to_request = blocks_in_piece
				- pi.finished - pi.writing - pi.requested;

			if (free_to_request == 0)
			{
				if (i.last_requested == min_time())
					i.last_requested = now;

				// if it's been more than half of the typical download time
				// of a piece since we requested the last block, allow
				// one more request per block
				if (m_average_piece_time > 0)
					timed_out = int(total_milliseconds(now - i.last_requested)
						/ std::max(int(m_average_piece_time + m_piece_time_deviation / 2), 1));

#if TORRENT_DEBUG_STREAMING > 0
				i.timed_out = timed_out;
#endif
				// every block in this piece is already requested
				// there's no need to consider this piece, unless it
				// appears to be stalled.
				if (pi.requested == 0 || timed_out == 0)
				{
#if TORRENT_DEBUG_STREAMING > 1
					std::printf("skipping %d (full) [req: %d timed_out: %d ]\n"
						, i.piece, pi.requested
						, timed_out);
#endif

					// if requested is 0, it means all blocks have been received, and
					// we're just waiting for it to flush them to disk.
					// if last_requested is recent enough, we should give it some
					// more time
					// skip to the next piece
					continue;
				}

				// it's been too long since we requested the last block from
				// this piece. Allow re-requesting blocks from this piece
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("timed out [average-piece-time: %d ms ]\n"
					, m_average_piece_time);
#endif
			}

			// pick all blocks for this piece. the peers list is kept up to date
			// and sorted. when we issue a request to a peer, its download queue
			// time will increase and it may need to be bumped in the peers list,
			// since it's ordered by download queue time
			pick_time_critical_block(peers, ignore_peers
				, peers_with_requests
				, pi, &i, m_picker.get()
				, blocks_in_piece, timed_out);

			// put back the peers we ignored into the peer list for the next piece
			if (!ignore_peers.empty())
			{
				peers.insert(peers.begin(), ignore_peers.begin(), ignore_peers.end());
				ignore_peers.clear();

				// TODO: instead of resorting the whole list, insert the peers
				// directly into the right place
				std::sort(peers.begin(), peers.end()
					, [] (peer_connection const* lhs, peer_connection const* rhs)
					{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });
			}

			// if this peer's download time exceeds 2 seconds, we're done.
			// We don't want to build unreasonably long request queues
			if (!peers.empty() && peers[0]->download_queue_time() > milliseconds(2000))
				break;
		}

		// commit all the time critical requests
		for (auto* p : peers_with_requests)
		{
			p->send_block_requests();
		}
	}